

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmLocalGenerator *pcVar2;
  cmMakefile *pcVar3;
  pointer ppcVar4;
  bool bVar5;
  int iVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->FilesReplacedDuringGenerate);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0042WarnTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0068WarnTargets)._M_t);
  iVar6 = (*this->_vptr_cmGlobalGenerator[0x30])(this);
  if ((char)iVar6 != '\0') {
    FinalizeTargetCompileInfo(this);
    CreateGenerationObjects(this,AllTargets);
    FillProjectMap(this);
    bVar5 = QtAutoGen(this);
    if (bVar5) {
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar8 = (this->LocalGenerators).
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar1;
          ppcVar8 = ppcVar8 + 1) {
        (*(*ppcVar8)->_vptr_cmLocalGenerator[4])();
      }
      ppcVar8 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar1 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        if (ppcVar8 == ppcVar1) {
          ppcVar1 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar8 = (this->LocalGenerators).
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar1;
              ppcVar8 = ppcVar8 + 1) {
            pcVar2 = *ppcVar8;
            pcVar3 = pcVar2->Makefile;
            ppcVar7 = (pcVar3->InstallGenerators).
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppcVar4 = (pcVar3->InstallGenerators).
                      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            while (ppcVar7 != ppcVar4) {
              iVar6 = (*((*ppcVar7)->super_cmScriptGenerator)._vptr_cmScriptGenerator[10])
                                (*ppcVar7,pcVar2);
              ppcVar7 = ppcVar7 + 1;
              if ((char)iVar6 == '\0') {
                return false;
              }
            }
          }
          (*this->_vptr_cmGlobalGenerator[0xc])(this);
          ppcVar1 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar8 = (this->LocalGenerators).
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar1;
              ppcVar8 = ppcVar8 + 1) {
            cmLocalGenerator::TraceDependencies(*ppcVar8);
          }
          bVar5 = CheckTargetsForMissingSources(this);
          if (bVar5) {
            return false;
          }
          (*this->_vptr_cmGlobalGenerator[0x32])(this);
          ppcVar1 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar8 = (this->LocalGenerators).
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar1;
              ppcVar8 = ppcVar8 + 1) {
            cmLocalGenerator::ComputeTargetManifest(*ppcVar8);
          }
          iVar6 = (*this->_vptr_cmGlobalGenerator[0x2f])(this);
          if ((char)iVar6 == '\0') {
            return false;
          }
          bVar5 = CheckTargetsForType(this);
          if (bVar5) {
            return false;
          }
          ppcVar1 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar8 = (this->LocalGenerators).
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar1;
              ppcVar8 = ppcVar8 + 1) {
            (*(*ppcVar8)->_vptr_cmLocalGenerator[3])();
          }
          return true;
        }
        bVar5 = cmLocalGenerator::ComputeTargetCompileFeatures(*ppcVar8);
        ppcVar8 = ppcVar8 + 1;
      } while (bVar5);
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Finalize the set of compile features for each target.
  // FIXME: This turns into calls to cmMakefile::AddRequiredTargetFeature
  // which actually modifies the <lang>_STANDARD target property
  // on the original cmTarget instance.  It accumulates features
  // across all configurations.  Some refactoring is needed to
  // compute a per-config resulta purely during generation.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (cmInstallGenerator* g : mf->GetInstallGenerators()) {
      if (!g->Compute(localGen)) {
        return false;
      }
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }

  if (this->CheckTargetsForType()) {
    return false;
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}